

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double eval_guided_crit_weighted<float,long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 vector<double,_std::allocator<double>_> *w)

{
  ulong __n;
  pointer pdVar1;
  MissingAction missing_action_00;
  double *pdVar2;
  size_t *psVar3;
  size_t ix;
  long lVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  double *pdVar7;
  size_t sVar8;
  double *pdVar9;
  size_t *ix_arr_00;
  long lVar10;
  size_t row;
  double dVar11;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ignored;
  allocator_type local_69;
  ulong local_68;
  double local_60;
  double local_58;
  _Vector_base<double,_std::allocator<double>_> local_50;
  size_t local_38;
  
  missing_action_00 = missing_action;
  psVar3 = buffer_pos;
  pdVar2 = buffer_arr;
  local_58 = min_gain;
  todense<float,long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  local_68 = end - st;
  __n = local_68 + 1;
  lVar10 = end * 8 + st * -8;
  sVar8 = 0;
  for (lVar4 = lVar10 + 8; lVar4 != 0; lVar4 = lVar4 + -8) {
    psVar3[sVar8] = sVar8;
    sVar8 = sVar8 + 1;
  }
  ix_arr_00 = psVar3;
  if (missing_action == Impute) {
    missing_action_00 = Fail;
    uVar5 = 0;
    do {
      ix_arr_00 = buffer_pos;
      if (__n == uVar5) goto LAB_0028a318;
      pdVar7 = pdVar2 + uVar5;
      uVar5 = uVar5 + 1;
    } while ((ulong)ABS(*pdVar7) < 0x7ff0000000000000);
    puVar6 = (unsigned_long *)((long)buffer_pos + (__n & 0xfffffffffffffffe) * 4);
    std::
    nth_element<unsigned_long*,eval_guided_crit_weighted<float,long,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,float*,long*,long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>
              (buffer_pos,puVar6,psVar3 + local_68 + 1,(anon_class_8_1_0f1c67a0)&buffer_arr);
    pdVar2 = saved_xmedian;
    dVar11 = buffer_arr[*puVar6];
    *saved_xmedian = dVar11;
    pdVar7 = buffer_arr;
    uVar5 = __n;
    if ((local_68 & 1) != 0) {
      local_60 = dVar11;
      puVar6 = std::__max_element<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                         (buffer_pos,puVar6);
      dVar11 = ((double)CONCAT44(0x45300000,(int)(*puVar6 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)*puVar6) - 4503599627370496.0);
      *pdVar2 = (local_60 - dVar11) * 0.5 + dVar11;
      pdVar7 = buffer_arr;
    }
    while (uVar5 != 0) {
      pdVar9 = pdVar2;
      if ((ulong)ABS(*pdVar7) < 0x7ff0000000000000) {
        pdVar9 = pdVar7;
      }
      *pdVar7 = *pdVar9;
      pdVar7 = pdVar7 + 1;
      uVar5 = uVar5 - 1;
    }
    missing_action_00 = Fail;
    sVar8 = 0;
    for (lVar10 = lVar10 + 8; ix_arr_00 = buffer_pos, lVar10 != 0; lVar10 = lVar10 + -8) {
      buffer_pos[sVar8] = sVar8;
      sVar8 = sVar8 + 1;
    }
  }
LAB_0028a318:
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_50,__n,&local_69);
  pdVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (; st <= end; st = st + 1) {
    *local_50._M_impl.super__Vector_impl_data._M_start = pdVar1[ix_arr[st]];
    local_50._M_impl.super__Vector_impl_data._M_start =
         local_50._M_impl.super__Vector_impl_data._M_start + 1;
  }
  dVar11 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                     (ix_arr_00,0,local_68,buffer_arr,buffer_arr + __n,as_relative_gain,
                      saved_xmedian,(double *)0x0,&local_38,split_point,xmin,xmax,criterion,local_58
                      ,missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,ncols,Xr,
                      Xr_ind,Xr_indptr,(vector<double,_std::allocator<double>_> *)&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return dVar11;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}